

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Cast_x86_avx::forward(Cast_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int _elempack;
  int *piVar2;
  _func_int **pp_Var3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  ulong uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  unsigned_short uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  void *pvVar17;
  _func_int *p_Var18;
  uint uVar19;
  void *pvVar20;
  long lVar21;
  undefined1 (*pauVar22) [16];
  undefined1 (*pauVar23) [16];
  int iVar24;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  size_t sVar28;
  ulong uVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  
  p_Var18 = this->_vptr_Cast_x86_avx[-3];
  if (*(int *)(&this->field_0xd0 + (long)p_Var18) == *(int *)(&this->field_0xd4 + (long)p_Var18)) {
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar2 = bottom_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = top_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar2 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar2;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar15 = bottom_blob->w;
    iVar24 = bottom_blob->h;
    iVar1 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar15;
    top_blob->h = iVar24;
    top_blob->d = iVar1;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
    return 0;
  }
  iVar15 = bottom_blob->w;
  iVar24 = bottom_blob->h;
  iVar1 = bottom_blob->d;
  uVar16 = bottom_blob->c;
  iVar13 = bottom_blob->dims;
  _elempack = bottom_blob->elempack;
  sVar28 = (size_t)_elempack;
  switch(*(int *)(&this->field_0xd4 + (long)p_Var18)) {
  case 1:
    if (*(int *)(&this->field_0xd0 + (long)p_Var18) == 3) {
      Cast::forward((Cast *)((long)&this->_vptr_Cast_x86_avx + (long)p_Var18),bottom_blob,top_blob,
                    opt);
    }
    sVar28 = sVar28 * 4;
    break;
  case 2:
  case 4:
    sVar28 = (size_t)(_elempack * 2);
    break;
  case 3:
    break;
  default:
    sVar28 = bottom_blob->elemsize;
  }
  switch(iVar13) {
  case 1:
    Mat::create(top_blob,iVar15,sVar28,_elempack,opt->blob_allocator);
    break;
  case 2:
    Mat::create(top_blob,iVar15,iVar24,sVar28,_elempack,opt->blob_allocator);
    break;
  case 3:
    Mat::create(top_blob,iVar15,iVar24,uVar16,sVar28,_elempack,opt->blob_allocator);
    break;
  case 4:
    Mat::create(top_blob,iVar15,iVar24,iVar1,uVar16,sVar28,_elempack,opt->blob_allocator);
  }
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx[-3]) == 1) &&
     (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx[-3]) == 2)) {
    iVar13 = cpu_support_x86_f16c();
    if (iVar13 == 0) {
      iVar13 = bottom_blob->c;
      if (0 < (long)iVar13) {
        iVar14 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar21 = 0;
        do {
          if (0 < iVar14) {
            sVar28 = top_blob->cstep;
            sVar4 = bottom_blob->cstep;
            sVar5 = top_blob->elemsize;
            pvVar17 = top_blob->data;
            sVar6 = bottom_blob->elemsize;
            pvVar20 = bottom_blob->data;
            lVar26 = 0;
            do {
              uVar12 = float32_to_float16(*(float *)((long)pvVar20 +
                                                    lVar26 * 4 + sVar4 * sVar6 * lVar21));
              *(unsigned_short *)((long)pvVar17 + lVar26 * 2 + sVar28 * sVar5 * lVar21) = uVar12;
              lVar26 = lVar26 + 1;
            } while (iVar14 != (int)lVar26);
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 != iVar13);
      }
    }
    else {
      cast_fp32_to_fp16_sse_f16c(bottom_blob,top_blob,opt);
    }
  }
  auVar31 = in_ZMM3._0_16_;
  if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx[-3]) == 2) &&
     (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx[-3]) == 1)) {
    iVar13 = cpu_support_x86_f16c();
    auVar31 = in_ZMM3._0_16_;
    if (iVar13 == 0) {
      iVar13 = bottom_blob->c;
      if (0 < (long)iVar13) {
        iVar14 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar21 = 0;
        do {
          if (0 < iVar14) {
            sVar28 = top_blob->cstep;
            sVar4 = bottom_blob->cstep;
            sVar5 = top_blob->elemsize;
            pvVar17 = top_blob->data;
            sVar6 = bottom_blob->elemsize;
            pvVar20 = bottom_blob->data;
            lVar26 = 0;
            do {
              fVar30 = float16_to_float32(*(unsigned_short *)
                                           ((long)pvVar20 + lVar26 * 2 + sVar4 * sVar6 * lVar21));
              *(float *)((long)pvVar17 + lVar26 * 4 + sVar28 * sVar5 * lVar21) = fVar30;
              lVar26 = lVar26 + 1;
            } while (iVar14 != (int)lVar26);
          }
          auVar31 = in_ZMM3._0_16_;
          lVar21 = lVar21 + 1;
        } while (lVar21 != iVar13);
      }
    }
    else {
      cast_fp16_to_fp32_sse_f16c(bottom_blob,top_blob,opt);
    }
  }
  pp_Var3 = this->_vptr_Cast_x86_avx;
  p_Var18 = pp_Var3[-3];
  iVar13 = *(int *)(&this->field_0xd0 + (long)p_Var18);
  if (iVar13 == 3) {
    if ((int)uVar16 < 1 || *(int *)(&this->field_0xd4 + (long)p_Var18) != 1) goto LAB_00497d7e;
    uVar19 = iVar1 * _elempack * iVar24 * iVar15;
    pvVar17 = bottom_blob->data;
    sVar28 = bottom_blob->cstep;
    pvVar20 = top_blob->data;
    sVar4 = top_blob->cstep;
    sVar5 = top_blob->elemsize;
    sVar6 = bottom_blob->elemsize;
    uVar25 = 0;
    do {
      if (0 < (int)uVar19) {
        uVar29 = 0;
        do {
          *(float *)((long)pvVar20 + uVar29 * 4) = (float)(int)*(char *)((long)pvVar17 + uVar29);
          uVar29 = uVar29 + 1;
        } while (uVar19 != uVar29);
      }
      uVar25 = uVar25 + 1;
      pvVar20 = (void *)((long)pvVar20 + sVar4 * sVar5);
      pvVar17 = (void *)((long)pvVar17 + sVar28 * sVar6);
    } while (uVar25 != uVar16);
    p_Var18 = pp_Var3[-3];
    iVar13 = *(int *)(&this->field_0xd0 + (long)p_Var18);
  }
  if ((iVar13 == 1) && (*(int *)(&this->field_0xd4 + (long)p_Var18) == 4)) {
    iVar15 = cpu_support_x86_avx2();
    auVar11 = _DAT_00554ae0;
    auVar10 = _DAT_00554ac0;
    if (iVar15 == 0) {
      iVar15 = bottom_blob->c;
      if (0 < (long)iVar15) {
        uVar16 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar21 = 0;
        auVar32._8_8_ = 0x8000000000000000;
        auVar32._0_8_ = 0x8000000000000000;
        auVar31 = vpcmpeqd_avx(auVar31,auVar31);
        do {
          pauVar22 = (undefined1 (*) [16])
                     (bottom_blob->cstep * lVar21 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar23 = (undefined1 (*) [16])
                     (top_blob->cstep * lVar21 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar16 < 0x10) {
            uVar19 = 0;
          }
          else {
            iVar24 = 0xf;
            do {
              auVar33 = vpsrld_avx(*pauVar22,0x10);
              auVar34 = vpsrld_avx(pauVar22[1],0x10);
              auVar33 = vpackusdw_avx(auVar33,auVar34);
              auVar34 = vpsrld_avx(pauVar22[2],0x10);
              auVar35 = vpsrld_avx(pauVar22[3],0x10);
              auVar34 = vpackusdw_avx(auVar34,auVar35);
              pauVar23[1] = auVar34;
              *pauVar23 = auVar33;
              pauVar22 = pauVar22 + 4;
              pauVar23 = pauVar23 + 2;
              iVar24 = iVar24 + 0x10;
              uVar19 = uVar16 & 0xfffffff0;
            } while (iVar24 < (int)uVar16);
          }
          uVar27 = uVar19 | 7;
          while ((int)uVar27 < (int)uVar16) {
            auVar33 = vpsrld_avx(*pauVar22,0x10);
            auVar34 = vpsrld_avx(pauVar22[1],0x10);
            auVar33 = vpackusdw_avx(auVar33,auVar34);
            *pauVar23 = auVar33;
            pauVar22 = pauVar22 + 2;
            pauVar23 = pauVar23 + 1;
            uVar27 = uVar19 + 0xf;
            uVar19 = uVar19 + 8;
          }
          if ((int)uVar19 < (int)uVar16) {
            uVar25 = CONCAT44(0,~uVar19 + uVar16);
            auVar33._8_8_ = 0;
            auVar33._0_8_ = uVar25;
            auVar35 = vpshufd_avx(auVar33,0x44);
            auVar33 = vorps_avx(auVar35,auVar32);
            auVar34 = vorps_avx(auVar35,auVar32);
            auVar35 = vorps_avx(auVar35,auVar32);
            uVar29 = 0;
            do {
              auVar36._8_8_ = 0;
              auVar36._0_8_ = uVar29;
              auVar36 = vpshufd_avx(auVar36,0x44);
              auVar38._16_16_ = auVar36;
              auVar38._0_16_ = auVar36;
              auVar7 = vorps_avx(auVar38,auVar10);
              auVar38 = vorps_avx(auVar38,auVar11);
              auVar37._0_8_ = auVar38._16_8_ ^ 0x8000000000000000;
              auVar37._8_4_ = auVar38._24_4_;
              auVar37._12_4_ = auVar38._28_4_ ^ 0x80000000;
              auVar8 = vpcmpgtq_avx(auVar37,auVar33);
              uVar9 = auVar38._0_8_;
              auVar40._0_8_ = uVar9 ^ 0x8000000000000000;
              auVar39._8_4_ = auVar38._8_4_;
              auVar40._8_4_ = auVar39._8_4_;
              uVar19 = auVar38._12_4_;
              auVar40._12_4_ = uVar19 ^ 0x80000000;
              auVar36 = vpcmpgtq_avx(auVar40,auVar34);
              auVar36 = vpackssdw_avx(auVar36,auVar8);
              auVar42._0_8_ = auVar7._16_8_ ^ 0x8000000000000000;
              auVar42._8_4_ = auVar7._24_4_;
              auVar42._12_4_ = auVar7._28_4_ ^ 0x80000000;
              auVar40 = vpcmpgtq_avx(auVar42,auVar33);
              auVar45._0_8_ = auVar7._0_8_ ^ 0x8000000000000000;
              auVar44._8_4_ = auVar7._8_4_;
              auVar45._8_4_ = auVar44._8_4_;
              auVar45._12_4_ = auVar7._12_4_ ^ 0x80000000;
              auVar37 = vpcmpgtq_avx(auVar45,auVar35);
              auVar37 = vpackssdw_avx(auVar37,auVar40);
              auVar36 = vpackssdw_avx(auVar37 ^ auVar31,auVar36 ^ auVar31);
              auVar37 = vpmovsxwd_avx(auVar36);
              auVar42 = vpunpckhwd_avx(auVar36,auVar36);
              auVar41._16_16_ = auVar42;
              auVar41._0_16_ = auVar37;
              auVar38 = vmaskmovps_avx(auVar41,*(undefined1 (*) [32])(*pauVar22 + uVar29 * 4));
              if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(*pauVar23 + uVar29 * 2) = auVar38._2_2_;
              }
              auVar44._0_8_ = auVar7._0_8_ ^ 0x8000000000000000;
              auVar44._12_4_ = auVar7._12_4_ ^ 0x80000000;
              auVar36 = vpcmpgtq_avx(auVar44,auVar35);
              auVar36 = vpackssdw_avx(auVar36,auVar36);
              auVar36 = vpackssdw_avx(auVar36 ^ auVar31,auVar36 ^ auVar31);
              if ((auVar36 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(*pauVar23 + uVar29 * 2 + 2) = auVar38._6_2_;
              }
              auVar36 = vpackssdw_avx(auVar40,auVar40);
              auVar36 = vpackssdw_avx(auVar36 ^ auVar31,auVar36 ^ auVar31);
              if ((auVar36 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(*pauVar23 + uVar29 * 2 + 4) = auVar38._10_2_;
              }
              auVar36 = vpackssdw_avx(auVar40,auVar40);
              auVar36 = vpackssdw_avx(auVar36 ^ auVar31,auVar36 ^ auVar31);
              if ((auVar36 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(*pauVar23 + uVar29 * 2 + 6) = auVar38._14_2_;
              }
              auVar43._8_4_ = auVar39._8_4_;
              auVar43._0_8_ = uVar9 ^ 0x8000000000000000;
              auVar43._12_4_ = uVar19 ^ 0x80000000;
              auVar36 = vpcmpgtq_avx(auVar43,auVar34);
              auVar36 = vpackssdw_avx(auVar36,auVar36);
              auVar36 = vpackssdw_avx(auVar36 ^ auVar31,auVar36 ^ auVar31);
              if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(*pauVar23 + uVar29 * 2 + 8) = auVar38._18_2_;
              }
              auVar39._0_8_ = uVar9 ^ 0x8000000000000000;
              auVar39._12_4_ = uVar19 ^ 0x80000000;
              auVar36 = vpcmpgtq_avx(auVar39,auVar34);
              auVar36 = vpackssdw_avx(auVar36,auVar36);
              auVar36 = vpackssdw_avx(auVar36 ^ auVar31,auVar36 ^ auVar31);
              if ((auVar36 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(*pauVar23 + uVar29 * 2 + 10) = auVar38._22_2_;
              }
              auVar36 = vpackssdw_avx(auVar8,auVar8);
              auVar36 = vpackssdw_avx(auVar36 ^ auVar31,auVar36 ^ auVar31);
              if ((auVar36 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(*pauVar23 + uVar29 * 2 + 0xc) = auVar38._26_2_;
              }
              auVar36 = vpackssdw_avx(auVar8,auVar8);
              auVar36 = vpackssdw_avx(auVar36 ^ auVar31,auVar36 ^ auVar31);
              if ((auVar36 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(*pauVar23 + uVar29 * 2 + 0xe) = auVar38._30_2_;
              }
              uVar29 = uVar29 + 8;
            } while ((uVar25 + 8 & 0xfffffffffffffff8) != uVar29);
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 != iVar15);
      }
    }
    else {
      cast_fp32_to_bf16_sse_avx2(bottom_blob,top_blob,opt);
    }
  }
LAB_00497d7e:
  if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx[-3]) == 4) &&
     (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx[-3]) == 1)) {
    iVar15 = cpu_support_x86_avx2();
    if (iVar15 == 0) {
      iVar15 = bottom_blob->c;
      if (0 < (long)iVar15) {
        uVar16 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar21 = 0;
        auVar31 = ZEXT816(0) << 0x40;
        do {
          pauVar22 = (undefined1 (*) [16])
                     (bottom_blob->cstep * lVar21 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar23 = (undefined1 (*) [16])
                     (top_blob->cstep * lVar21 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar16 < 8) {
            uVar19 = 0;
          }
          else {
            iVar24 = 7;
            do {
              auVar33 = vpunpcklwd_avx(auVar31,*pauVar22);
              auVar32 = vpunpckhwd_avx(auVar31,*pauVar22);
              pauVar23[1] = auVar32;
              *pauVar23 = auVar33;
              pauVar22 = pauVar22 + 1;
              pauVar23 = pauVar23 + 2;
              iVar24 = iVar24 + 8;
              uVar19 = uVar16 & 0xfffffff8;
            } while (iVar24 < (int)uVar16);
          }
          uVar27 = uVar19 | 3;
          while ((int)uVar27 < (int)uVar16) {
            auVar34._8_8_ = 0;
            auVar34._0_8_ = *(ulong *)*pauVar22;
            auVar32 = vpunpcklwd_avx(auVar31,auVar34);
            *pauVar23 = auVar32;
            pauVar22 = (undefined1 (*) [16])(*pauVar22 + 8);
            pauVar23 = pauVar23 + 1;
            uVar27 = uVar19 + 7;
            uVar19 = uVar19 + 4;
          }
          if (uVar16 - uVar19 != 0 && (int)uVar19 <= (int)uVar16) {
            lVar26 = 0;
            do {
              *(uint *)(*pauVar23 + lVar26 * 4) = (uint)*(ushort *)(*pauVar22 + lVar26 * 2) << 0x10;
              lVar26 = lVar26 + 1;
            } while (uVar16 - uVar19 != (int)lVar26);
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 != iVar15);
      }
    }
    else {
      cast_bf16_to_fp32_sse_avx2(bottom_blob,top_blob,opt);
    }
  }
  return 0;
}

Assistant:

int Cast_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}